

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_close(nni_ws *ws,uint16_t code)

{
  _Bool _Var1;
  nng_err result;
  nni_aio *pnVar2;
  ws_frame *local_40;
  ws_frame *frame;
  uint8_t buf [2];
  
  while( true ) {
    pnVar2 = (nni_aio *)nni_list_first(&ws->recvq);
    if (pnVar2 == (nni_aio *)0x0) break;
    nni_aio_list_remove(pnVar2);
    nni_aio_finish_error(pnVar2,NNG_ECLOSED);
  }
  if (ws->closed == false) {
    nni_aio_close(&ws->connaio);
    nni_aio_close(&ws->httpaio);
    frame._6_2_ = code << 8 | code >> 8;
    if ((ws->closed == false) && (ws->ready == true)) {
      pnVar2 = &ws->closeaio;
      ws->closed = true;
      nni_aio_reset(pnVar2);
      ws->wclose = true;
      result = ws_msg_init_control(&local_40,ws,'\b',(uint8_t *)((long)&frame + 6),2);
      if (result == NNG_OK) {
        _Var1 = nni_aio_start(pnVar2,ws_cancel_close,ws);
        if (_Var1) {
          nni_list_prepend(&ws->txq,local_40);
          ws_start_write(ws);
        }
        else {
          ws->wclose = false;
          ws_frame_fini(local_40);
        }
      }
      else {
        ws->wclose = false;
        nni_aio_finish_error(pnVar2,result);
      }
    }
  }
  return;
}

Assistant:

static void
ws_close(nni_ws *ws, uint16_t code)
{
	nng_aio *aio;

	// Receive stuff gets aborted always.  No further receives
	// once we get a close.
	while ((aio = nni_list_first(&ws->recvq)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	// If were closing "gracefully", then don't abort in-flight
	// stuff yet.  Note that reads should have stopped already.
	// However, we *do* abort any inflight HTTP negotiation, or
	// pending connect request.
	if (!ws->closed) {
		// ABORT connection negotiation.
		nni_aio_close(&ws->connaio);
		nni_aio_close(&ws->httpaio);
		ws_send_close(ws, code);
	}
}